

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  pointer pbVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  cmsysProcess *cp;
  pointer pcVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar9;
  vector<char,std::allocator<char>> *pvVar10;
  string *a;
  pointer pbVar11;
  bool bVar12;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char *data;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_2d8 [11];
  cmProcessOutput local_2cd;
  int local_2cc;
  string *local_2c8;
  cmCTest *local_2c0;
  vector<char,_std::allocator<char>_> local_2b8;
  vector<char,_std::allocator<char>_> local_298;
  long *local_278;
  long local_268 [2];
  string *local_258;
  char *local_250;
  vector<char,_std::allocator<char>_> local_248;
  vector<char,_std::allocator<char>_> local_228;
  int *local_210;
  string local_208;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8 = stdErr;
  local_2c0 = this;
  local_258 = (string *)timeout.__r;
  local_210 = retVal;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_1e8,
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != pbVar1) {
    do {
      local_1a8._0_8_ = (pbVar11->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_1e8,(char **)local_1a8);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar1);
  }
  local_1a8._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1e8,(char **)local_1a8);
  stdOut->_M_string_length = 0;
  *(stdOut->_M_dataplus)._M_p = '\0';
  local_2c8->_M_string_length = 0;
  *(local_2c8->_M_dataplus)._M_p = '\0';
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,(double)local_258);
  cmsysProcess_Execute(cp);
  local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258 = stdOut;
  cmProcessOutput::cmProcessOutput(&local_2cd,encoding,0x400);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  bVar12 = false;
  do {
    uVar4 = cmsysProcess_WaitForData(cp,&local_250,&local_2cc,(double *)0x0);
    if (uVar4 == 2) {
      pvVar10 = (vector<char,std::allocator<char>> *)&local_298;
LAB_00192ef0:
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>(pvVar10);
      bVar3 = bVar12;
    }
    else {
      bVar3 = true;
      if (uVar4 == 3) {
        pvVar10 = (vector<char,std::allocator<char>> *)&local_2b8;
        goto LAB_00192ef0;
      }
    }
    if (((uVar4 & 0xfffffffe) == 2) &&
       (((local_2c0->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ExtraVerbose == true)) {
      cmProcessOutput::DecodeText(&local_2cd,local_250,(long)local_2cc,&local_208,0);
      cmSystemTools::Stdout(&local_208);
    }
    psVar2 = local_258;
    bVar12 = bVar3;
  } while (!bVar3);
  if (((local_2c0->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ExtraVerbose == true) {
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    cmProcessOutput::DecodeText(&local_2cd,&local_1c8,&local_208,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if (local_208._M_string_length != 0) {
      cmSystemTools::Stdout(&local_208);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar8 < 0) goto LAB_00193581;
    pcVar6 = (pointer)operator_new(uVar8);
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar6 + uVar8;
    sVar9 = (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar6;
    if (sVar9 != 0) {
      local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar6;
      memmove(pcVar6,local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar9);
    }
    local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar6 + sVar9;
    cmProcessOutput::DecodeText(&local_2cd,&local_228,&local_298,0);
    if (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append
              ((char *)psVar2,
               (ulong)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)uVar8 < 0) {
LAB_00193581:
      std::__throw_bad_alloc();
    }
    pcVar6 = (pointer)operator_new(uVar8);
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar6 + uVar8;
    sVar9 = (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar6;
    if (sVar9 != 0) {
      local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar6;
      memmove(pcVar6,local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar9);
    }
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar6 + sVar9;
    cmProcessOutput::DecodeText(&local_2cd,&local_248,&local_2b8,0);
    if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::string::append
              ((char *)local_2c8,
               (ulong)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  iVar5 = cmsysProcess_GetState(cp);
  if (iVar5 == 4) {
    if (local_210 == (int *)0x0) {
      iVar5 = cmsysProcess_GetExitValue(cp);
      bVar12 = iVar5 == 0;
    }
    else {
      iVar5 = cmsysProcess_GetExitValue(cp);
      *local_210 = iVar5;
      bVar12 = true;
    }
  }
  else {
    iVar5 = cmsysProcess_GetState(cp);
    if (iVar5 == 2) {
      pcVar7 = cmsysProcess_GetExceptionString(cp);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x130);
      }
      else {
        sVar9 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
      }
      std::ios::widen((char)(ostringstream *)local_1a8 +
                      (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(local_2c0,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xdbb,(char *)local_278,false);
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      strlen(pcVar7);
      std::__cxx11::string::append((char *)local_2c8,(ulong)pcVar7);
    }
    else {
      iVar5 = cmsysProcess_GetState(cp);
      if (iVar5 == 1) {
        pcVar7 = cmsysProcess_GetErrorString(cp);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_2d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x130);
        }
        else {
          sVar9 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
        }
        std::ios::widen((char)(ostringstream *)local_1a8 +
                        (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_2c0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xdc0,(char *)local_278,false);
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        strlen(pcVar7);
        std::__cxx11::string::append((char *)local_2c8,(ulong)pcVar7);
      }
      else {
        iVar5 = cmsysProcess_GetState(cp);
        bVar12 = true;
        if (iVar5 != 5) goto LAB_001934f5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Process terminated due to timeout\n",0x22);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_2c0,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xdc5,(char *)local_278,false);
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        std::__cxx11::string::append((char *)local_2c8,0x750da8);
      }
    }
    bVar12 = false;
  }
LAB_001934f5:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  if (local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempOutput;
  std::vector<char> tempError;
  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  int res;
  bool done = false;
  while (!done) {
    res = cmsysProcess_WaitForData(cp, &data, &length, nullptr);
    switch (res) {
      case cmsysProcess_Pipe_STDOUT:
        cm::append(tempOutput, data, data + length);
        break;
      case cmsysProcess_Pipe_STDERR:
        cm::append(tempError, data, data + length);
        break;
      default:
        done = true;
    }
    if ((res == cmsysProcess_Pipe_STDOUT || res == cmsysProcess_Pipe_STDERR) &&
        this->Impl->ExtraVerbose) {
      processOutput.DecodeText(data, length, strdata);
      cmSystemTools::Stdout(strdata);
    }
  }
  if (this->Impl->ExtraVerbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    cmCTestLog(this, ERROR_MESSAGE, exception_str << std::endl);
    stdErr->append(exception_str, strlen(exception_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}